

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

void __thiscall
google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
          (InternalMetadataWithArenaLite *this,string *other)

{
  void *pvVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  
  pvVar1 = (this->
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           ).ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    pbVar2 = InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ::mutable_unknown_fields_slow
                       (&this->
                         super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                       );
  }
  else {
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  std::__cxx11::string::_M_append((char *)pbVar2,(ulong)(other->_M_dataplus)._M_p);
  return;
}

Assistant:

void DoMergeFrom(const string& other) {
    mutable_unknown_fields()->append(other);
  }